

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmlookup.cpp
# Opt level: O2

void __thiscall CVmObjLookupTable::populate_from_list(CVmObjLookupTable *this,vm_val_t *src)

{
  int iVar1;
  int idx;
  int idx_00;
  vm_val_t val;
  vm_val_t key;
  
  iVar1 = vm_val_t::ll_length(src);
  idx_00 = 1;
  while( true ) {
    if (iVar1 <= idx_00) break;
    idx = idx_00 + 1;
    vm_val_t::ll_index(src,&key,idx_00);
    idx_00 = idx_00 + 2;
    vm_val_t::ll_index(src,&val,idx);
    set_or_add_entry(this,&key,&val);
  }
  if (idx_00 <= iVar1) {
    vm_val_t::ll_index(src,(vm_val_t *)((this->super_CVmObjCollection).super_CVmObject.ext_ + 0x10),
                       idx_00);
  }
  return;
}

Assistant:

void CVmObjLookupTable::populate_from_list(VMG_ const vm_val_t *src)
{
    /* copy elements from the source object */
    int cnt = src->ll_length(vmg0_);
    int i;
    for (i = 1 ; i + 1 <= cnt ; )
    {
        vm_val_t key, val;

        /* get the next two elements - they're always key, value pairs */
        src->ll_index(vmg_ &key, i++);
        src->ll_index(vmg_ &val, i++);

        /* set them in the table */
        set_or_add_entry(vmg_ &key, &val);
    }

    /* if there's a single remaining entry, it's the default value */
    if (i <= cnt)
        src->ll_index(vmg_ &get_ext()->default_value, i);
}